

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

void obj_no_longer_held(obj *obj)

{
  ushort uVar1;
  uint uVar2;
  obj *contents;
  obj *obj_00;
  
  if (obj != (obj *)0x0) {
    uVar1 = obj->otyp;
    if ((uVar1 - 0xda < 8) || (uVar1 == 0x215)) {
      obj_00 = obj->cobj;
      if (obj_00 == (obj *)0x0) {
        return;
      }
      for (; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
        obj_no_longer_held(obj_00);
      }
      uVar1 = obj->otyp;
    }
    if (uVar1 == 0x1a) {
      uVar2 = *(uint *)&obj->field_0x4a;
      if ((uVar2 >> 0xc & 1) != 0) {
        uVar2 = mt_random();
        if (uVar2 % 10 != 0) {
          return;
        }
        uVar2 = *(uint *)&obj->field_0x4a;
      }
      obj->otyp = 0x19;
      *(uint *)&obj->field_0x4a = uVar2 & 0xffffefff;
    }
  }
  return;
}

Assistant:

void obj_no_longer_held(struct obj *obj)
{
	if (!obj) {
	    return;
	} else if ((Is_container(obj) || obj->otyp == STATUE) && obj->cobj) {
	    struct obj *contents;
	    for (contents=obj->cobj; contents; contents=contents->nobj)
		obj_no_longer_held(contents);
	}
	switch(obj->otyp) {
	case CRYSKNIFE:
	    /* KMH -- Fixed crysknives have only 10% chance of reverting */
	    /* only changes when not held by player or monster */
	    if (!obj->oerodeproof || !rn2(10)) {
		obj->otyp = WORM_TOOTH;
		obj->oerodeproof = 0;
	    }
	    break;
	}
}